

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O3

glyph_t __thiscall QFontEngine::findGlyph(QFontEngine *this,QLatin1StringView name)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  hb_face_t *phVar4;
  long lVar5;
  ulong uVar6;
  glyph_t gVar7;
  undefined1 *puVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  hb_codepoint_t glyph;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  uVar6 = name.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  phVar4 = hb_qt_face_get_for_engine(this);
  lVar5 = hb_font_create(phVar4);
  if (lVar5 != 0) {
    hb_ot_font_set_funcs(lVar5);
    local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0xaaaaaaaa);
    iVar2 = hb_font_get_glyph_from_name(lVar5,name.m_data,uVar6 & 0xffffffff,&local_58);
    gVar7 = (glyph_t)local_58;
    hb_font_destroy(lVar5);
    if (gVar7 != 0 && iVar2 != 0) goto LAB_004a09c1;
  }
  QVar11.m_data = "gid";
  QVar11.m_size = 3;
  cVar1 = QtPrivate::startsWith(name,QVar11,CaseSensitive);
  if (cVar1 == '\0') {
    QVar12.m_data = "uni";
    QVar12.m_size = 3;
    cVar1 = QtPrivate::startsWith(name,QVar12,CaseSensitive);
    gVar7 = 0;
    if (cVar1 == '\0') goto LAB_004a09c1;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QVar10.m_data = (storage_type *)(uVar6 - 3);
    QVar10.m_size = (qsizetype)&local_58;
    QtPrivate::toUnsignedInteger(QVar10,(int)name.m_data + 3);
    if ((ulong)local_58 >> 0x20 != 0 || ((ulong)puStack_50 & 1) != 0) goto LAB_004a09c1;
    uVar3 = (*this->_vptr_QFontEngine[0xb])(this);
    puVar8 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0) goto LAB_004a09c1;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QVar9.m_data = (storage_type *)(uVar6 - 3);
    QVar9.m_size = (qsizetype)&local_58;
    QtPrivate::toUnsignedInteger(QVar9,(int)name.m_data + 3);
    gVar7 = 0;
    puVar8 = local_58;
    if ((ulong)local_58 >> 0x20 != 0 || ((ulong)puStack_50 & 1) != 0) goto LAB_004a09c1;
  }
  (*this->_vptr_QFontEngine[0x2c])(this);
  gVar7 = (glyph_t)puVar8;
LAB_004a09c1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return gVar7;
}

Assistant:

glyph_t QFontEngine::findGlyph(QLatin1StringView name) const
{
    glyph_t result = 0;

#if QT_CONFIG(harfbuzz)
    result = queryHarfbuzz(this, [name](hb_font_t *hbFont){
        // glyph names are all ASCII, so latin1 is fine here.
        hb_codepoint_t glyph;
        if (hb_font_get_glyph_from_name(hbFont, name.constData(), name.size(), &glyph))
            return glyph_t(glyph);
        return glyph_t(0);
    });
#else // if we are here, no point in trying again if we already tried harfbuzz
    if (!result) {
        for (glyph_t index = 0; index < uint(glyphCount()); ++index) {
            if (name == glyphName(index))
                return index;
        }
    }
#endif

    if (!result) {
        constexpr auto gid = "gid"_L1;
        constexpr auto uni = "uni"_L1;
        if (name.startsWith(gid)) {
            bool ok;
            result = name.slice(gid.size()).toUInt(&ok);
            if (ok && result < glyph_t(glyphCount()))
                return result;
        } else if (name.startsWith(uni)) {
            bool ok;
            const uint ucs4 = name.slice(uni.size()).toUInt(&ok, 16);
            if (ok) {
                result = glyphIndex(ucs4);
                if (result > 0 && result < glyph_t(glyphCount()))
                    return result;
            }
        }
    }

    return result;
}